

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 uVar1;
  char cVar2;
  short sVar3;
  NameContext *pNVar4;
  Parse *pPVar5;
  SrcList *pSVar6;
  AggInfo *pAVar7;
  char *zName;
  ExprList *pEVar8;
  Expr *pEVar9;
  AggInfo_func *pAVar10;
  FuncDef *pFVar11;
  AggInfo_col *pAVar12;
  uint uVar13;
  int *piVar14;
  ulong uVar15;
  int iVar16;
  char *pcVar17;
  int iVar18;
  ExprList_item *pEVar19;
  AggInfo_func *pAVar20;
  uint uVar21;
  int i;
  int i_1;
  int local_38;
  int local_34;
  
  pNVar4 = (pWalker->u).pNC;
  pPVar5 = pNVar4->pParse;
  pSVar6 = pNVar4->pSrcList;
  pAVar7 = pNVar4->pAggInfo;
  uVar1 = pExpr->op;
  if (uVar1 != 0x9a) {
    if (uVar1 == 0x99) {
      if ((pNVar4->ncFlags & 8) != 0) {
        return 0;
      }
      if (pWalker->walkerDepth != (uint)pExpr->op2) {
        return 0;
      }
      pAVar10 = pAVar7->aFunc;
      uVar13 = pAVar7->nFunc;
      if (0 < (int)uVar13) {
        uVar15 = 0;
        pAVar20 = pAVar10;
        do {
          iVar16 = sqlite3ExprCompare(pAVar20->pExpr,pExpr);
          if (iVar16 == 0) goto LAB_00199175;
          uVar21 = (int)uVar15 + 1;
          uVar15 = (ulong)uVar21;
          pAVar20 = pAVar20 + 1;
        } while (uVar13 != uVar21);
      }
      uVar1 = pPVar5->db->aDb->pSchema->enc;
      pAVar10 = (AggInfo_func *)
                sqlite3ArrayAllocate(pPVar5->db,pAVar10,0x18,&pAVar7->nFunc,&local_34);
      pAVar7->aFunc = pAVar10;
      uVar15 = (ulong)local_34;
      if (-1 < (long)uVar15) {
        pAVar10[uVar15].pExpr = pExpr;
        iVar16 = pPVar5->nMem + 1;
        pPVar5->nMem = iVar16;
        pAVar10[uVar15].iMem = iVar16;
        zName = (pExpr->u).zToken;
        iVar16 = 0;
        uVar13 = 0;
        if (zName != (char *)0x0) {
          uVar13 = 0xffffffff;
          pcVar17 = zName;
          do {
            uVar13 = uVar13 + 1;
            cVar2 = *pcVar17;
            pcVar17 = pcVar17 + 1;
          } while (cVar2 != '\0');
          uVar13 = uVar13 & 0x3fffffff;
        }
        if ((pExpr->x).pList != (ExprList *)0x0) {
          iVar16 = ((pExpr->x).pList)->nExpr;
        }
        pFVar11 = sqlite3FindFunction(pPVar5->db,zName,uVar13,iVar16,uVar1,'\0');
        pAVar10[uVar15].pFunc = pFVar11;
        iVar16 = -1;
        if ((pExpr->flags & 0x10) != 0) {
          iVar16 = pPVar5->nTab;
          pPVar5->nTab = iVar16 + 1;
        }
        pAVar10[uVar15].iDistinct = iVar16;
      }
LAB_00199175:
      pExpr->iAgg = (i16)uVar15;
      pExpr->pAggInfo = pAVar7;
      return 1;
    }
    if (uVar1 != 0x98) {
      return 0;
    }
  }
  if ((pSVar6 != (SrcList *)0x0) && (iVar16 = (int)pSVar6->nSrc, 0 < pSVar6->nSrc)) {
    piVar14 = &pSVar6->a[0].iCursor;
    do {
      if (pExpr->iTable == *piVar14) {
        if (pAVar7->nColumn < 1) goto LAB_001991b9;
        piVar14 = &pAVar7->aCol->iColumn;
        uVar15 = 0;
        goto LAB_0019919c;
      }
      piVar14 = piVar14 + 0x1a;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
  }
  return 1;
  while( true ) {
    uVar13 = (int)uVar15 + 1;
    uVar15 = (ulong)uVar13;
    piVar14 = piVar14 + 8;
    if (pAVar7->nColumn == uVar13) break;
LAB_0019919c:
    if ((piVar14[-1] == pExpr->iTable) && (*piVar14 == (int)pExpr->iColumn)) goto LAB_00199269;
  }
LAB_001991b9:
  pAVar12 = (AggInfo_col *)
            sqlite3ArrayAllocate(pPVar5->db,pAVar7->aCol,0x20,&pAVar7->nColumn,&local_38);
  pAVar7->aCol = pAVar12;
  uVar15 = (ulong)local_38;
  if (-1 < (long)uVar15) {
    pAVar12[uVar15].pTab = pExpr->pTab;
    iVar16 = pExpr->iTable;
    pAVar12[uVar15].iTable = iVar16;
    sVar3 = pExpr->iColumn;
    pAVar12[uVar15].iColumn = (int)sVar3;
    iVar18 = pPVar5->nMem + 1;
    pPVar5->nMem = iVar18;
    pAVar12[uVar15].iMem = iVar18;
    pAVar12[uVar15].pExpr = pExpr;
    pEVar8 = pAVar7->pGroupBy;
    if ((pEVar8 != (ExprList *)0x0) && (0 < pEVar8->nExpr)) {
      pEVar19 = pEVar8->a;
      iVar18 = 0;
      do {
        pEVar9 = pEVar19->pExpr;
        if (((pEVar9->op == 0x98) && (pEVar9->iTable == iVar16)) && (pEVar9->iColumn == sVar3))
        goto LAB_00199266;
        iVar18 = iVar18 + 1;
        pEVar19 = pEVar19 + 1;
      } while (pEVar8->nExpr != iVar18);
    }
    iVar18 = pAVar7->nSortingColumn;
    pAVar7->nSortingColumn = iVar18 + 1;
LAB_00199266:
    pAVar12[uVar15].iSorterColumn = iVar18;
  }
LAB_00199269:
  pExpr->pAggInfo = pAVar7;
  pExpr->op = 0x9a;
  pExpr->iAgg = (i16)uVar15;
  return 1;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->pAggInfo;

  switch( pExpr->op ){
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        struct SrcList_item *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.  
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable &&
                  pCol->iColumn==pExpr->iColumn ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0 
            ){
              pCol = &pAggInfo->aCol[k];
              pCol->pTab = pExpr->pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pExpr = pExpr;
              if( pAggInfo->pGroupBy ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN && pE->iTable==pExpr->iTable &&
                      pE->iColumn==pExpr->iColumn ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetIrreducible(pExpr);
            pExpr->pAggInfo = pAggInfo;
            pExpr->op = TK_AGG_COLUMN;
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate 
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( sqlite3ExprCompare(pItem->pExpr, pExpr)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( !ExprHasProperty(pExpr, EP_IntValue) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken, sqlite3Strlen30(pExpr->u.zToken),
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasAnyProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetIrreducible(pExpr);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}